

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall State::apply(State *this,State *dst)

{
  bool bVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  
  if (this->update != false) {
    if ((this->flags).newMessage == true) {
      dst->update = true;
      (dst->flags).newMessage = true;
      Message::operator=(&dst->message,&this->message);
    }
    if ((this->flags).newSpectrum == true) {
      dst->update = true;
      (dst->flags).newSpectrum = true;
      std::vector<float,_std::allocator<float>_>::_M_move_assign(&dst->rxSpectrum,&this->rxSpectrum)
      ;
    }
    if ((this->flags).newTxAmplitude == true) {
      dst->update = true;
      (dst->flags).newTxAmplitude = true;
      ggvector<short>::assign((ggvector *)&dst->txAmplitude);
    }
    if ((this->flags).newStats == true) {
      dst->update = true;
      (dst->flags).newStats = true;
      bVar1 = (this->stats).analyzing;
      uVar2 = *(undefined2 *)&(this->stats).field_0x2;
      iVar3 = (this->stats).framesToRecord;
      iVar4 = (this->stats).framesLeftToRecord;
      iVar5 = (this->stats).framesToAnalyze;
      iVar6 = (this->stats).framesLeftToAnalyze;
      iVar7 = (this->stats).samplesPerFrame;
      fVar8 = (this->stats).sampleRateInp;
      fVar9 = (this->stats).sampleRateOut;
      fVar10 = (this->stats).sampleRateOut;
      fVar11 = (this->stats).sampleRate;
      iVar12 = (this->stats).sampleSizeInp;
      iVar13 = (this->stats).sampleSizeOut;
      (dst->stats).receiving = (this->stats).receiving;
      (dst->stats).analyzing = bVar1;
      *(undefined2 *)&(dst->stats).field_0x2 = uVar2;
      (dst->stats).framesToRecord = iVar3;
      (dst->stats).framesLeftToRecord = iVar4;
      (dst->stats).framesToAnalyze = iVar5;
      (dst->stats).framesLeftToAnalyze = iVar6;
      (dst->stats).samplesPerFrame = iVar7;
      (dst->stats).sampleRateInp = fVar8;
      (dst->stats).sampleRateOut = fVar9;
      (dst->stats).sampleRateOut = fVar10;
      (dst->stats).sampleRate = fVar11;
      (dst->stats).sampleSizeInp = iVar12;
      (dst->stats).sampleSizeOut = iVar13;
    }
    if ((this->flags).newTxProtocols == true) {
      dst->update = true;
      (dst->flags).newTxProtocols = true;
      memcpy(&dst->txProtocols,&this->txProtocols,0x160);
    }
    (this->flags).newStats = false;
    (this->flags).newTxProtocols = false;
    this->update = false;
    (this->flags).newMessage = false;
    (this->flags).newSpectrum = false;
    (this->flags).newTxAmplitude = false;
  }
  return;
}

Assistant:

void apply(State & dst) {
        if (update == false) return;

        if (this->flags.newMessage) {
            dst.update = true;
            dst.flags.newMessage = true;
            dst.message = std::move(this->message);
        }

        if (this->flags.newSpectrum) {
            dst.update = true;
            dst.flags.newSpectrum = true;
            dst.rxSpectrum = std::move(this->rxSpectrum);
        }

        if (this->flags.newTxAmplitude) {
            dst.update = true;
            dst.flags.newTxAmplitude = true;
            dst.txAmplitude.assign(this->txAmplitude);
        }

        if (this->flags.newStats) {
            dst.update = true;
            dst.flags.newStats = true;
            dst.stats = std::move(this->stats);
        }

        if (this->flags.newTxProtocols) {
            dst.update = true;
            dst.flags.newTxProtocols = true;
            dst.txProtocols = std::move(this->txProtocols);
        }

        flags.clear();
        update = false;
    }